

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

int __thiscall gl4cts::TextureBarrierBaseTest::init(TextureBarrierBaseTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int in_EAX;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  
  if (this->m_api == API_GL_ARB_texture_barrier) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_texture_barrier");
    in_EAX = (int)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      return in_EAX;
    }
  }
  if (this->m_api == API_GL_45core) {
    return in_EAX;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Required texture_barrier extension is not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual void init()
	{
		if (!featureSupported())
		{
			throw tcu::NotSupportedError("Required texture_barrier extension is not supported");
		}
	}